

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O1

void __thiscall minihttp::Request::Request(Request *this,string *h,string *res,int p,void *u)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined4 in_register_0000000c;
  undefined8 in_R9;
  
  paVar1 = &(this->protocol).field_2;
  (this->protocol)._M_dataplus._M_p = (pointer)paVar1;
  (this->protocol)._M_string_length = 0;
  (this->protocol).field_2._M_local_buf[0] = '\0';
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  pcVar2 = (h->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host,pcVar2,pcVar2 + h->_M_string_length,
             CONCAT44(in_register_0000000c,p),u,in_R9,paVar1);
  (this->header)._M_dataplus._M_p = (pointer)&(this->header).field_2;
  (this->header)._M_string_length = 0;
  (this->header).field_2._M_local_buf[0] = '\0';
  (this->resource)._M_dataplus._M_p = (pointer)&(this->resource).field_2;
  pcVar2 = (res->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->resource,pcVar2,pcVar2 + res->_M_string_length);
  (this->extraGetHeaders)._M_dataplus._M_p = (pointer)&(this->extraGetHeaders).field_2;
  (this->extraGetHeaders)._M_string_length = 0;
  (this->extraGetHeaders).field_2._M_local_buf[0] = '\0';
  this->port = 0x50;
  this->user = u;
  this->useSSL = false;
  (this->post).data._M_dataplus._M_p = (pointer)&(this->post).data.field_2;
  (this->post).data._M_string_length = 0;
  (this->post).data.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Request(const std::string& h, const std::string& res, int p = 80, void *u = NULL)
        : host(h), resource(res), port(80), user(u), useSSL(false) {}